

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# borg7.c
# Opt level: O1

_Bool borg_enchant_to_h(void)

{
  ushort uVar1;
  short sVar2;
  short sVar3;
  borg_item *pbVar4;
  _Bool _Var5;
  ulong uVar6;
  long lVar7;
  int iVar8;
  ulong uVar9;
  bool bVar10;
  bool bVar11;
  int local_38;
  wchar_t local_34;
  
  if (((my_need_enchant_to_h != 0) || (enchant_weapon_swap_to_h != L'\0')) &&
     ((borg_skill[0xd3] != 0 || (borg_skill[0xd5] != 0)))) {
    uVar1 = z_info->pack_size;
    if (uVar1 + 1 < (uint)uVar1) {
      local_34 = L'\xffffffff';
      local_38 = 99;
    }
    else {
      lVar7 = (ulong)uVar1 * 0x388 + 0x5c;
      local_38 = 99;
      local_34 = L'\xffffffff';
      uVar6 = (ulong)uVar1;
      do {
        pbVar4 = borg_items;
        if (((borg_items->desc[lVar7 + 8] != '\0') && (borg_items->desc[lVar7] == '\x01')) &&
           (borg_items->desc[lVar7 + 4] != '\x06')) {
          sVar2 = *(short *)(borg_items->desc + lVar7 + 0x18);
          iVar8 = (int)sVar2;
          _Var5 = borg_spell_okay_fail(ENCHANT_WEAPON,L'A');
          if ((_Var5) || (0 < borg_skill[0xd5])) {
            if (iVar8 < borg_cfg[0x1c]) goto LAB_0023adf0;
          }
          else if (sVar2 < 8) {
LAB_0023adf0:
            if ((((uVar6 != (ulong)z_info->pack_size + 1) || (2 < borg_skill[0x8a])) ||
                ((pbVar4->desc[lVar7 + 0xc] != '\0' || (pbVar4->desc[lVar7 + 0xd] != '\0')))) &&
               (local_34 < L'\0' || iVar8 <= local_38)) {
              local_34 = (wchar_t)uVar6;
              local_38 = iVar8;
            }
          }
        }
        lVar7 = lVar7 + 0x388;
        bVar10 = uVar6 <= z_info->pack_size;
        uVar6 = uVar6 + 1;
      } while (bVar10);
    }
    lVar7 = (long)weapon_swap;
    if (((lVar7 != 0) && (borg_items[lVar7 + -1].ident == true)) &&
       (borg_items[lVar7 + -1].tval != '\x06')) {
      sVar2 = borg_items[lVar7 + -1].to_h;
      iVar8 = (int)sVar2;
      _Var5 = borg_spell_okay_fail(ENCHANT_WEAPON,L'A');
      if ((_Var5) || (0 < borg_skill[0xd5])) {
        bVar10 = borg_cfg[0x1c] <= iVar8;
      }
      else {
        bVar10 = 7 < sVar2;
      }
      if ((iVar8 < local_38) && (!bVar10)) {
        local_34 = weapon_swap + L'\xffffffff';
        local_38 = iVar8;
      }
    }
    if (local_34 < L'\0') {
      uVar1 = z_info->pack_size;
      uVar6 = (ulong)uVar1;
      if (uVar1 + 0xc < (uint)z_info->quiver_size + (uint)uVar1 + 0xc) {
        uVar9 = uVar6 + 0xc;
        lVar7 = uVar6 * 0x388 + 0x2abc;
        do {
          if ((2 < borg_skill[0x8a]) &&
             ((((borg_items[uVar6 + 1].art_idx != '\0' || (borg_items[uVar6 + 1].ego_idx != '\0'))
               && (4 < (byte)borg_items->desc[lVar7 + 8])) &&
              ((borg_items->desc[lVar7] == '\x01' &&
               (borg_skill[0x88] == (uint)(byte)borg_items->desc[lVar7 + 4])))))) {
            sVar2 = *(short *)(borg_items->desc + lVar7 + 0x18);
            iVar8 = (int)sVar2;
            _Var5 = borg_spell_okay_fail(ENCHANT_WEAPON,L'A');
            if ((_Var5) || (0 < borg_skill[0xd5])) {
              bVar11 = SBORROW2(sVar2,9);
              sVar3 = sVar2 + -9;
              bVar10 = sVar2 == 9;
            }
            else {
              bVar11 = SBORROW2(sVar2,7);
              sVar3 = sVar2 + -7;
              bVar10 = sVar3 == 0;
            }
            if (bVar10 || bVar11 != sVar3 < 0) {
              bVar10 = iVar8 <= local_38;
              if (local_34 < L'\0' || bVar10) {
                local_38 = iVar8;
              }
              if (local_34 < L'\0' || bVar10) {
                local_34 = (wchar_t)uVar9;
              }
            }
          }
          uVar9 = uVar9 + 1;
          uVar6 = (ulong)z_info->pack_size;
          lVar7 = lVar7 + 0x388;
        } while (uVar9 < z_info->quiver_size + uVar6 + 0xc);
      }
    }
    if ((L'\xffffffff' < local_34) &&
       (((_Var5 = borg_read_scroll(sv_scroll_star_enchant_weapon), _Var5 ||
         (_Var5 = borg_read_scroll(sv_scroll_enchant_weapon_to_hit), _Var5)) ||
        (_Var5 = borg_spell_fail(ENCHANT_WEAPON,L'A'), _Var5)))) {
      borg_pick_weapon(local_34);
      return true;
    }
  }
  return false;
}

Assistant:

static bool borg_enchant_to_h(void)
{
    int i, b_i = -1;
    int a, s_a, b_a = 99;

    /* Nothing to enchant */
    if (!my_need_enchant_to_h && !enchant_weapon_swap_to_h)
        return (false);

    /* Need "enchantment" ability */
    if ((!borg_skill[BI_AENCH_TOH]) && (!borg_skill[BI_AENCH_SWEP]))
        return (false);

    /* Look for a weapon that needs enchanting */
    for (i = INVEN_WIELD; i <= INVEN_BOW; i++) {
        borg_item* item = &borg_items[i];

        /* Skip empty items */
        if (!item->iqty)
            continue;

        /* Skip non-identified items */
        if (!item->ident)
            continue;

        /* Skip my swap digger */
        if (item->tval == TV_DIGGING)
            continue;

        /* Obtain the bonus */
        a = item->to_h;

        /* Skip "boring" items */
        if (borg_spell_okay_fail(ENCHANT_WEAPON, 65)
            || borg_skill[BI_AENCH_SWEP] >= 1) {
            if (a >= borg_cfg[BORG_ENCHANT_LIMIT])
                continue;
        } else {
            if (a >= 8)
                continue;
        }

        /* Most classes store the enchants until they get
         * a 3x shooter (like a long bow).
         * Generally, we do not want the x2 shooter enchanted,
         * since it wastes scrolls.  But if the sword is at +5
         * and the sling at +2, then the sling will be selected
         * because its enchantment is lower.  The borg tries to
         * enchant the least enchanted item.  This will make sure
         * the x2 shooter is skipped and the sword is enchanted,
         * if needed.  If the sword is at +9,+9, and the sling at
         * +0,+0 and the borg has some enchant scrolls, he should
         * store them instead of wasting them on the sling.
         */
        if (i == INVEN_BOW && /* bow */
            borg_skill[BI_AMMO_POWER] < 3 && /* 3x shooter */
            (!item->art_idx && !item->ego_idx)) /* Not artifact or ego */
            continue;

        /* Find the least enchanted item */
        if ((b_i >= 0) && (b_a < a))
            continue;

        /* Save the info */
        b_i = i;
        b_a = a;
    }
    if (weapon_swap) {
        bool skip       = false;
        borg_item* item = &borg_items[weapon_swap - 1];

        /* Skip my swap digger and anything unid'd */
        if (item->ident && item->tval != TV_DIGGING) {
            /* Obtain the bonus */
            s_a = item->to_h;

            /* Skip items that are already enchanted */
            if (borg_spell_okay_fail(ENCHANT_WEAPON, 65)
                || borg_skill[BI_AENCH_SWEP] >= 1) {
                if (s_a >= borg_cfg[BORG_ENCHANT_LIMIT])
                    skip = true;
            } else {
                if (s_a >= 8)
                    skip = true;
            }

            /* Find the least enchanted item */
            if (b_a > s_a && !skip) {
                /* Save the info */
                b_i = weapon_swap - 1;
                b_a = s_a;
            }
        }
    }
    /* Nothing, check ammo */
    if (b_i < 0) {
        /* look through inventory for ammo */
        for (i = QUIVER_START; i < QUIVER_END; i++) {
            borg_item* item = &borg_items[i];

            /* Only enchant ammo if we have a good shooter,
             * otherwise, store the enchants in the home.
             */
            if (borg_skill[BI_AMMO_POWER] < 3
                || (!borg_items[INVEN_BOW].art_idx
                    && !borg_items[INVEN_BOW].ego_idx))
                continue;

            /* Only enchant if qty >= 5 */
            if (item->iqty < 5)
                continue;

            /* Skip non-identified items  */
            if (!item->ident)
                continue;

            /* Make sure it is the right type if missile */
            if (item->tval != borg_skill[BI_AMMO_TVAL])
                continue;

            /* Obtain the bonus  */
            a = item->to_h;

            /* Skip items that are already enchanted */
            if (borg_spell_okay_fail(ENCHANT_WEAPON, 65)
                || borg_skill[BI_AENCH_SWEP] >= 1) {
                if (a >= 10)
                    continue;
            } else {
                if (a >= 8)
                    continue;
            }

            /* Find the least enchanted item */
            if ((b_i >= 0) && (b_a < a))
                continue;

            /* Save the info  */
            b_i = i;
            b_a = a;
        }
    }

    /* Nothing */
    if (b_i < 0)
        return (false);

    /* Enchant it */
    if (borg_read_scroll(sv_scroll_star_enchant_weapon)
        || borg_read_scroll(sv_scroll_enchant_weapon_to_hit)
        || borg_spell_fail(ENCHANT_WEAPON, 65)) {
        borg_pick_weapon(b_i);

        /* Success */
        return (true);
    }

    /* Nothing to do */
    return (false);
}